

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O0

void __thiscall
preciseUnitOps_assignment_Test::~preciseUnitOps_assignment_Test
          (preciseUnitOps_assignment_Test *this)

{
  preciseUnitOps_assignment_Test *this_local;
  
  ~preciseUnitOps_assignment_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(preciseUnitOps, assignment)
{
    precise_unit U1;

    EXPECT_NE(U1, precise::ft);
    U1 = precise::ft;
    EXPECT_EQ(U1, precise::ft);
    auto U2 = std::make_shared<precise_unit>();
    EXPECT_NE(*U2, precise::mile);
    *U2 = precise::mile;
    EXPECT_EQ(*U2, precise::mile);
}